

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

optional<pbrt::CameraRay> * __thiscall
pbrt::OrthographicCamera::GenerateRay
          (OrthographicCamera *this,CameraSample sample,SampledWavelengths *lambda)

{
  Point2f *in_RSI;
  optional<pbrt::CameraRay> *in_RDI;
  undefined1 auVar1 [64];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  Point3<float> PVar8;
  Point3f PVar9;
  Vector3<float> VVar10;
  Point3<float> *in_stack_00000038;
  Transform *in_stack_00000040;
  Point3f pFocus;
  Float ft;
  Point2f pLens;
  Ray ray;
  Point3f pCamera;
  Point3f pFilm;
  float in_stack_fffffffffffffe88;
  Float in_stack_fffffffffffffe8c;
  undefined4 in_stack_fffffffffffffe90;
  float in_stack_fffffffffffffe94;
  CameraBase *in_stack_fffffffffffffe98;
  optional<pbrt::CameraRay> *o;
  Ray *this_00;
  Float t;
  Ray *in_stack_fffffffffffffed0;
  undefined1 local_68 [104];
  undefined1 auVar7 [56];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  auVar7 = (undefined1  [56])0x0;
  this_00 = (Ray *)(local_68 + 0x44);
  o = in_RDI;
  Point3<float>::Point3
            ((Point3<float> *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
             in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88,0.0);
  PVar8 = Transform::operator()(in_stack_00000040,in_stack_00000038);
  local_68._48_4_ = PVar8.super_Tuple3<pbrt::Point3,_float>.z;
  auVar1._0_8_ = PVar8.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar1._8_56_ = auVar7;
  local_68._40_8_ = vmovlpd_avx(auVar1._0_16_);
  local_68._56_8_ = local_68._40_8_;
  local_68._64_4_ = local_68._48_4_;
  Vector3<float>::Vector3
            ((Vector3<float> *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
             in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88,0.0);
  CameraBase::SampleTime
            ((CameraBase *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
             in_stack_fffffffffffffe8c);
  MediumHandle::MediumHandle
            ((MediumHandle *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
             (MediumHandle *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  Ray::Ray(this_00,(Point3f *)o,(Vector3f *)in_RDI,(Float)((ulong)in_stack_fffffffffffffe98 >> 0x20)
           ,(MediumHandle *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  if (0.0 < in_RSI[0xb0].super_Tuple2<pbrt::Point2,_float>.x) {
    in_stack_fffffffffffffe94 = in_RSI[0xb0].super_Tuple2<pbrt::Point2,_float>.x;
    auVar2._0_8_ = SampleUniformDiskConcentric(in_RSI);
    t = (Float)((ulong)in_RSI >> 0x20);
    auVar2._8_56_ = extraout_var;
    vmovlpd_avx(auVar2._0_16_);
    auVar3._0_8_ = pbrt::operator*(in_stack_fffffffffffffe8c,(Tuple2<pbrt::Point2,_float> *)0x6b69d2
                                  );
    auVar3._8_56_ = extraout_var_00;
    vmovlpd_avx(auVar3._0_16_);
    auVar7 = (undefined1  [56])0x0;
    in_stack_fffffffffffffe98 = (CameraBase *)local_68;
    PVar9 = Ray::operator()(in_stack_fffffffffffffed0,t);
    auVar4._0_8_ = PVar9.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar4._8_56_ = auVar7;
    vmovlpd_avx(auVar4._0_16_);
    auVar7 = (undefined1  [56])0x0;
    Point3<float>::Point3
              ((Point3<float> *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
               in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88,0.0);
    VVar10 = Point3<float>::operator-
                       ((Point3<float> *)in_RDI,(Point3<float> *)in_stack_fffffffffffffe98);
    auVar5._0_8_ = VVar10.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar5._8_56_ = auVar7;
    vmovlpd_avx(auVar5._0_16_);
    VVar10 = Normalize<float>((Vector3<float> *)this_00);
    local_68._20_4_ = VVar10.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar6._0_8_ = VVar10.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar6._8_56_ = auVar7;
    local_68._12_8_ = vmovlpd_avx(auVar6._0_16_);
  }
  CameraBase::RenderFromCamera
            (in_stack_fffffffffffffe98,
             (Ray *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  SampledSpectrum::SampledSpectrum
            ((SampledSpectrum *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
             in_stack_fffffffffffffe8c);
  pstd::optional<pbrt::CameraRay>::optional
            ((optional<pbrt::CameraRay> *)
             CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
             (CameraRay *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  return o;
}

Assistant:

pstd::optional<CameraRay> OrthographicCamera::GenerateRay(
    CameraSample sample, SampledWavelengths &lambda) const {
    // Compute raster and camera sample positions
    Point3f pFilm = Point3f(sample.pFilm.x, sample.pFilm.y, 0);
    Point3f pCamera = cameraFromRaster(pFilm);

    Ray ray(pCamera, Vector3f(0, 0, 1), SampleTime(sample.time), medium);
    // Modify ray for depth of field
    if (lensRadius > 0) {
        // Sample point on lens
        Point2f pLens = lensRadius * SampleUniformDiskConcentric(sample.pLens);

        // Compute point on plane of focus
        Float ft = focalDistance / ray.d.z;
        Point3f pFocus = ray(ft);

        // Update ray for effect of lens
        ray.o = Point3f(pLens.x, pLens.y, 0);
        ray.d = Normalize(pFocus - ray.o);
    }

    return CameraRay{RenderFromCamera(ray)};
}